

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NetworkUpdateParameters::MergeFrom
          (NetworkUpdateParameters *this,NetworkUpdateParameters *from)

{
  void *pvVar1;
  LogMessage *other;
  Optimizer *this_00;
  Int64Parameter *pIVar2;
  BoolParameter *this_01;
  Optimizer *from_00;
  Int64Parameter *pIVar3;
  BoolParameter *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x11c7a);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
            (&(this->losslayers_).super_RepeatedPtrFieldBase,
             &(from->losslayers_).super_RepeatedPtrFieldBase);
  from_00 = from->optimizer_;
  if (from_00 != (Optimizer *)0x0 &&
      from != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    this_00 = this->optimizer_;
    if (this_00 == (Optimizer *)0x0) {
      this_00 = (Optimizer *)operator_new(0x20);
      Optimizer::Optimizer(this_00);
      this->optimizer_ = this_00;
      from_00 = from->optimizer_;
    }
    if (from_00 == (Optimizer *)0x0) {
      from_00 = (Optimizer *)&_Optimizer_default_instance_;
    }
    Optimizer::MergeFrom(this_00,from_00);
  }
  pIVar3 = from->epochs_;
  if (pIVar3 != (Int64Parameter *)0x0 &&
      from != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    pIVar2 = this->epochs_;
    if (pIVar2 == (Int64Parameter *)0x0) {
      pIVar2 = (Int64Parameter *)operator_new(0x28);
      Int64Parameter::Int64Parameter(pIVar2);
      this->epochs_ = pIVar2;
      pIVar3 = from->epochs_;
    }
    if (pIVar3 == (Int64Parameter *)0x0) {
      pIVar3 = (Int64Parameter *)&_Int64Parameter_default_instance_;
    }
    Int64Parameter::MergeFrom(pIVar2,pIVar3);
  }
  from_01 = from->shuffle_;
  if (from_01 != (BoolParameter *)0x0 &&
      from != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    this_01 = this->shuffle_;
    if (this_01 == (BoolParameter *)0x0) {
      this_01 = (BoolParameter *)operator_new(0x18);
      BoolParameter::BoolParameter(this_01);
      this->shuffle_ = this_01;
      from_01 = from->shuffle_;
    }
    if (from_01 == (BoolParameter *)0x0) {
      from_01 = (BoolParameter *)&_BoolParameter_default_instance_;
    }
    BoolParameter::MergeFrom(this_01,from_01);
  }
  pIVar3 = from->seed_;
  if (pIVar3 != (Int64Parameter *)0x0 &&
      from != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    pIVar2 = this->seed_;
    if (pIVar2 == (Int64Parameter *)0x0) {
      pIVar2 = (Int64Parameter *)operator_new(0x28);
      Int64Parameter::Int64Parameter(pIVar2);
      this->seed_ = pIVar2;
      pIVar3 = from->seed_;
    }
    if (pIVar3 == (Int64Parameter *)0x0) {
      pIVar3 = (Int64Parameter *)&_Int64Parameter_default_instance_;
    }
    Int64Parameter::MergeFrom(pIVar2,pIVar3);
  }
  return;
}

Assistant:

void NetworkUpdateParameters::MergeFrom(const NetworkUpdateParameters& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NetworkUpdateParameters)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  losslayers_.MergeFrom(from.losslayers_);
  if (from.has_optimizer()) {
    mutable_optimizer()->::CoreML::Specification::Optimizer::MergeFrom(from.optimizer());
  }
  if (from.has_epochs()) {
    mutable_epochs()->::CoreML::Specification::Int64Parameter::MergeFrom(from.epochs());
  }
  if (from.has_shuffle()) {
    mutable_shuffle()->::CoreML::Specification::BoolParameter::MergeFrom(from.shuffle());
  }
  if (from.has_seed()) {
    mutable_seed()->::CoreML::Specification::Int64Parameter::MergeFrom(from.seed());
  }
}